

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void ERR_put_error(int lib,int func,int reason,char *file,int line)

{
  uint uVar1;
  uint uVar2;
  ERR_STATE *pEVar3;
  uint *puVar4;
  
  pEVar3 = err_get_state();
  if (pEVar3 != (ERR_STATE *)0x0) {
    if (lib == 2 && reason == 0) {
      puVar4 = (uint *)__errno_location();
      reason = *puVar4;
    }
    uVar1 = pEVar3->top;
    uVar2 = uVar1 + 1 & 0xf;
    pEVar3->top = uVar2;
    if (uVar2 == pEVar3->bottom) {
      pEVar3->bottom = uVar1 + 2 & 0xf;
    }
    err_clear(pEVar3->errors + uVar2);
    pEVar3->errors[uVar2].file = file;
    pEVar3->errors[uVar2].line = (uint16_t)line;
    pEVar3->errors[uVar2].packed = reason & 0xfffU | lib << 0x18;
  }
  return;
}

Assistant:

void ERR_put_error(int library, int unused, int reason, const char *file,
                   unsigned line) {
  ERR_STATE *const state = err_get_state();
  struct err_error_st *error;

  if (state == NULL) {
    return;
  }

  if (library == ERR_LIB_SYS && reason == 0) {
#if defined(OPENSSL_WINDOWS)
    reason = GetLastError();
#else
    reason = errno;
#endif
  }

  state->top = (state->top + 1) % ERR_NUM_ERRORS;
  if (state->top == state->bottom) {
    state->bottom = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[state->top];
  err_clear(error);
  error->file = file;
  error->line = line;
  error->packed = ERR_PACK(library, reason);
}